

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_artist.cpp
# Opt level: O2

void __thiscall polyscope::VectorArtist::draw(VectorArtist *this)

{
  bool bVar1;
  float fVar2;
  undefined8 uVar3;
  element_type *peVar4;
  ShaderProgram *p;
  string *this_00;
  vec4 vVar5;
  mat4 P;
  mat4 Pinv;
  allocator local_159;
  string local_158 [32];
  string local_138 [32];
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  mat<4,_4,_float,_(glm::qualifier)0> local_98;
  mat<4,_4,_float,_(glm::qualifier)0> local_58;
  
  p = (this->program).
      super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (p == (ShaderProgram *)0x0) {
    createProgram(this);
    p = (this->program).
        super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  Structure::setTransformUniforms(this->parentStructure,p);
  peVar4 = (this->program).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string(local_b8,"u_radius",(allocator *)&local_98);
  bVar1 = (this->vectorRadius).value.relativeFlag;
  fVar2 = (this->vectorRadius).value.value;
  (*peVar4->_vptr_ShaderProgram[5])
            ((ulong)((uint)(bVar1 & 1) * (int)(float)((double)fVar2 * state::lengthScale) +
                    (uint)!(bool)(bVar1 & 1) * (int)fVar2),peVar4,local_b8);
  std::__cxx11::string::~string(local_b8);
  peVar4 = (this->program).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string(local_d8,"u_baseColor",(allocator *)&local_98);
  uVar3._0_4_ = (this->vectorColor).value.field_0;
  uVar3._4_4_ = (this->vectorColor).value.field_1;
  (*peVar4->_vptr_ShaderProgram[9])
            (uVar3,(ulong)(uint)(this->vectorColor).value.field_2,peVar4,local_d8);
  std::__cxx11::string::~string(local_d8);
  peVar4 = (this->program).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this->vectorType == AMBIENT) {
    std::__cxx11::string::string(local_f8,"u_lengthMult",(allocator *)&local_98);
    (*peVar4->_vptr_ShaderProgram[6])(0x3ff0000000000000,peVar4,local_f8);
    this_00 = local_f8;
  }
  else {
    std::__cxx11::string::string(local_118,"u_lengthMult",(allocator *)&local_98);
    bVar1 = (this->vectorLengthMult).value.relativeFlag;
    fVar2 = (this->vectorLengthMult).value.value;
    (*peVar4->_vptr_ShaderProgram[6])
              ((double)(float)((uint)(bVar1 & 1) * (int)(float)((double)fVar2 * state::lengthScale)
                              + (uint)!(bool)(bVar1 & 1) * (int)fVar2) / this->maxLength,peVar4,
               local_118);
    this_00 = local_118;
  }
  std::__cxx11::string::~string(this_00);
  view::getCameraPerspectiveMatrix();
  glm::detail::compute_inverse<4,_4,_float,_(glm::qualifier)0,_false>::call(&local_58,&local_98);
  peVar4 = (this->program).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string(local_138,"u_invProjMatrix",&local_159);
  (*peVar4->_vptr_ShaderProgram[7])(peVar4,local_138,&local_58);
  std::__cxx11::string::~string(local_138);
  peVar4 = (this->program).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string(local_158,"u_viewport",&local_159);
  vVar5 = render::Engine::getCurrentViewport(render::engine);
  (*peVar4->_vptr_ShaderProgram[10])(vVar5._0_8_,vVar5._8_8_,peVar4,local_158);
  std::__cxx11::string::~string(local_158);
  (*((this->program).
     super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ShaderProgram[0x1e])();
  return;
}

Assistant:

void VectorArtist::draw() {
  if (program == nullptr) {
    createProgram();
  }

  // Set uniforms
  parentStructure.setTransformUniforms(*program);

  program->setUniform("u_radius", vectorRadius.get().asAbsolute());
  program->setUniform("u_baseColor", vectorColor.get());

  if (vectorType == VectorType::AMBIENT) {
    program->setUniform("u_lengthMult", 1.0);
  } else {
    program->setUniform("u_lengthMult", vectorLengthMult.get().asAbsolute() / maxLength);
  }

  glm::mat4 P = view::getCameraPerspectiveMatrix();
  glm::mat4 Pinv = glm::inverse(P);
  program->setUniform("u_invProjMatrix", glm::value_ptr(Pinv));
  program->setUniform("u_viewport", render::engine->getCurrentViewport());

  program->draw();
}